

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DequoteNumber(Parse *pParse,Expr *p)

{
  char cVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  int bHex;
  char *pOut;
  char *pIn;
  int iValue;
  char *local_30;
  char *local_28;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar6;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (char *)0x0) {
    local_28 = *(char **)(in_RSI + 8);
    local_30 = *(char **)(in_RSI + 8);
    bVar5 = false;
    if ((*local_28 == '0') && (bVar5 = true, local_28[1] != 'x')) {
      bVar5 = local_28[1] == 'X';
    }
    uVar6 = 0xaaaaaaaa;
    *in_RSI = -100;
    do {
      if (*local_28 == '_') {
        if (((!bVar5) && (((""[(byte)local_28[-1]] & 4) == 0 || ((""[(byte)local_28[1]] & 4) == 0)))
            ) || ((bVar5 && (((""[(byte)local_28[-1]] & 8) == 0 ||
                             ((""[(byte)local_28[1]] & 8) == 0)))))) {
          sqlite3ErrorMsg(in_RDI,"unrecognized token: \"%s\"",*(undefined8 *)(in_RSI + 8));
        }
      }
      else {
        pcVar4 = local_30 + 1;
        *local_30 = *local_28;
        local_30 = pcVar4;
        if (((*local_28 == 'e') || (*local_28 == 'E')) || (*local_28 == '.')) {
          *in_RSI = -0x66;
        }
      }
      cVar1 = *local_28;
      local_28 = local_28 + 1;
    } while (cVar1 != '\0');
    if (bVar5) {
      *in_RSI = -100;
    }
    if ((*in_RSI == -100) &&
       (iVar3 = sqlite3GetInt32((char *)CONCAT44(uVar6,in_stack_fffffffffffffff0),(int *)in_RDI),
       iVar3 != 0)) {
      *(undefined4 *)(in_RSI + 8) = uVar6;
      *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x800;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DequoteNumber(Parse *pParse, Expr *p){
  assert( p!=0 || pParse->db->mallocFailed );
  if( p ){
    const char *pIn = p->u.zToken;
    char *pOut = p->u.zToken;
    int bHex = (pIn[0]=='0' && (pIn[1]=='x' || pIn[1]=='X'));
    int iValue;
    assert( p->op==TK_QNUMBER );
    p->op = TK_INTEGER;
    do {
      if( *pIn!=SQLITE_DIGIT_SEPARATOR ){
        *pOut++ = *pIn;
        if( *pIn=='e' || *pIn=='E' || *pIn=='.' ) p->op = TK_FLOAT;
      }else{
        if( (bHex==0 && (!sqlite3Isdigit(pIn[-1]) || !sqlite3Isdigit(pIn[1])))
         || (bHex==1 && (!sqlite3Isxdigit(pIn[-1]) || !sqlite3Isxdigit(pIn[1])))
        ){
          sqlite3ErrorMsg(pParse, "unrecognized token: \"%s\"", p->u.zToken);
        }
      }
    }while( *pIn++ );
    if( bHex ) p->op = TK_INTEGER;

    /* tag-20240227-a: If after dequoting, the number is an integer that
    ** fits in 32 bits, then it must be converted into EP_IntValue.  Other
    ** parts of the code expect this.  See also tag-20240227-b. */
    if( p->op==TK_INTEGER && sqlite3GetInt32(p->u.zToken, &iValue) ){
      p->u.iValue = iValue;
      p->flags |= EP_IntValue;
    }
  }
}